

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_sorted.c
# Opt level: O3

rb_node * rb_iter_traversal(rb_node *current_state,rb_node **next_state)

{
  rb_node *prVar1;
  rb_node *prVar2;
  rb_node **pprVar3;
  rb_node *iter;
  
  if (current_state == (rb_node *)0x0) {
    return (rb_node *)0x0;
  }
  do {
    do {
      prVar2 = current_state;
      current_state = prVar2->left;
    } while (prVar2->left != (rb_node *)0x0);
    current_state = prVar2->right;
  } while (prVar2->right != (rb_node *)0x0);
  prVar1 = prVar2->parent;
  *next_state = prVar1;
  if (prVar1 == (rb_node *)0x0) {
    return prVar2;
  }
  if (prVar1->left == prVar2) {
    pprVar3 = &prVar1->left;
  }
  else {
    if (prVar1->right != prVar2) {
      return prVar2;
    }
    pprVar3 = &prVar1->right;
  }
  *pprVar3 = (rb_node *)0x0;
  return prVar2;
}

Assistant:

static struct rb_node *
rb_iter_traversal(struct rb_node *current_state, struct rb_node **next_state)
{
    struct rb_node *iter, *parent, *next;

    for (iter = current_state; iter; iter = next) {
        if (RBN_LEFT(iter)) {
            next = RBN_LEFT(iter);
            continue;
        } else if (RBN_RIGHT(iter)) {
            next = RBN_RIGHT(iter);
            continue;
        }

        *next_state = parent = RBN_PARENT(iter);

        if (parent && (RBN_LEFT(parent) == iter)) {
            RBN_LEFT(parent) = NULL;
        } else if (parent && (RBN_RIGHT(parent) == iter)) {
            RBN_RIGHT(parent) = NULL;
        }

        return iter;
    }

    return NULL;
}